

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.cpp
# Opt level: O2

IterateResult __thiscall deqp::TestSubcase::iterate(TestSubcase *this)

{
  int *piVar1;
  ostringstream *this_00;
  TestLog *this_01;
  qpTestResult testResult;
  int iVar2;
  int iVar3;
  int value;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *pcVar6;
  char *pcVar7;
  IterateResult IVar8;
  SubcaseBasePtr subcase;
  undefined1 local_1b0 [384];
  long lVar5;
  
  deqp::(anonymous_namespace)::current_context = (this->super_TestCase).m_context;
  this_01 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  (*this->m_factoryFunc)(&subcase);
  SubcaseBase::Documentation(subcase.m_ptr);
  ((subcase.m_ptr)->super_GLWrapper).super_CallLogWrapper.m_enableLog = true;
  iVar2 = (*((subcase.m_ptr)->super_GLWrapper)._vptr_GLWrapper[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  if (lVar5 == 0) {
    iVar2 = (*((subcase.m_ptr)->super_GLWrapper)._vptr_GLWrapper[2])();
    lVar5 = CONCAT44(extraout_var_00,iVar2);
    if (lVar5 == -1) {
      tcu::TestLog::writeMessage(this_01,"Test Run() failed");
      goto LAB_00d96937;
    }
  }
  else if (lVar5 == -1) {
    tcu::TestLog::writeMessage(this_01,"Test Setup() failed");
LAB_00d96937:
    lVar5 = -1;
  }
  iVar2 = (*((subcase.m_ptr)->super_GLWrapper)._vptr_GLWrapper[4])();
  if (CONCAT44(extraout_var_01,iVar2) == -1) {
    tcu::TestLog::writeMessage(this_01,"Test Cleanup() failed");
    lVar5 = -1;
  }
  ((subcase.m_ptr)->super_GLWrapper).super_CallLogWrapper.m_enableLog = false;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  value = (**(code **)(CONCAT44(extraout_var_02,iVar3) + 0x800))();
  iVar2 = 0x65;
  do {
    iVar2 = iVar2 + -1;
    if (iVar2 == 0) break;
    iVar4 = (**(code **)(CONCAT44(extraout_var_02,iVar3) + 0x800))();
  } while (iVar4 != 0);
  if (value == 0) {
    if (lVar5 == -1) goto LAB_00d96a06;
    if (lVar5 != 0x10) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      piVar1 = &this->m_iterationCount;
      *piVar1 = *piVar1 + -1;
      IVar8 = (IterateResult)(*piVar1 != 0);
      goto LAB_00d96a1b;
    }
    pcVar7 = "Not supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  else {
    pcVar6 = glu::getErrorName(value);
    pcVar7 = "UNKNOWN ERROR";
    if (pcVar6 != (char *)0x0) {
      pcVar7 = pcVar6;
    }
    this_00 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = this_01;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"After test execution glGetError() returned: ");
    std::operator<<((ostream *)this_00,pcVar7);
    std::operator<<((ostream *)this_00,", forcing FAIL for subcase");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
LAB_00d96a06:
    pcVar7 = "Fail";
    testResult = QP_TEST_RESULT_FAIL;
  }
  IVar8 = STOP;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,pcVar7);
LAB_00d96a1b:
  de::SharedPtr<deqp::SubcaseBase>::~SharedPtr(&subcase);
  return IVar8;
}

Assistant:

TestSubcase::IterateResult TestSubcase::iterate(void)
{
	current_context = &m_context;
	using namespace std;
	using tcu::TestLog;
	TestLog& log = m_testCtx.getLog();

	SubcaseBase::SubcaseBasePtr subcase = m_factoryFunc();
	subcase->Documentation();
	subcase->enableLogging(true);
	//Run subcase
	long subError = NO_ERROR;
	// test case setup
	try
	{
		subError = subcase->Setup();
		if (subError == ERROR)
			log.writeMessage("Test Setup() failed");
	}
	catch (const runtime_error& ex)
	{
		log.writeMessage(ex.what());
		subError = ERROR;
	}
	catch (...)
	{
		log.writeMessage("Undefined exception.");
		subError = ERROR;
	}

	// test case run
	if (subError == NO_ERROR)
	{
		try
		{
			subError = subcase->Run();
			if (subError == ERROR)
				log.writeMessage("Test Run() failed");
		}
		catch (const runtime_error& ex)
		{
			log.writeMessage(ex.what());
			subError = ERROR;
		}
		catch (...)
		{
			log.writeMessage("Undefined exception.");
			subError = ERROR;
		}
	}

	// test case cleanup
	try
	{
		if (subcase->Cleanup() == ERROR)
		{
			subError = ERROR;
			log.writeMessage("Test Cleanup() failed");
		}
	}
	catch (const runtime_error& ex)
	{
		log.writeMessage(ex.what());
		subError = ERROR;
	}
	catch (...)
	{
		log.writeMessage("Undefined exception.");
		subError = ERROR;
	}
	subcase->enableLogging(false);

	//check gl error state
	const glw::Functions& gl	  = m_context.getRenderContext().getFunctions();
	glw::GLenum			  glError = gl.getError();
	for (int i = 0; i < 100 && gl.getError(); ++i)
		;
	if (glError != GL_NO_ERROR)
	{
		const char* name = glu::getErrorName(glError);
		if (name == DE_NULL)
			name = "UNKNOWN ERROR";
		log << TestLog::Message << "After test execution glGetError() returned: " << name
			<< ", forcing FAIL for subcase" << TestLog::EndMessage;
		subError = ERROR;
	}

	if (subError == ERROR)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}
	else if (subError == NOT_SUPPORTED)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not supported");
		return STOP;
	}
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	if (--m_iterationCount)
		return CONTINUE;
	else
		return STOP;
}